

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

void __thiscall cmsys::anon_unknown_3::SymbolProperties::SymbolProperties(SymbolProperties *this)

{
  string local_60;
  string local_40;
  SymbolProperties *local_10;
  SymbolProperties *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->SourceFile);
  std::__cxx11::string::string((string *)&this->Function);
  SetBinary(this,"???");
  SetBinaryBaseAddress(this,(void *)0x0);
  this->Address = (void *)0x0;
  SetSourceFile(this,"???");
  SetFunction(this,"???");
  SetLineNumber(this,-1);
  SetReportPath(this,0);
  GetRealAddress(this);
  (anonymous_namespace)::SymbolProperties::GetFunction_abi_cxx11_(&local_40,this);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::SymbolProperties::GetSourceFile_abi_cxx11_(&local_60,this);
  std::__cxx11::string::~string((string *)&local_60);
  GetLineNumber(this);
  return;
}

Assistant:

SymbolProperties::SymbolProperties()
{
  // not using an initializer list
  // to avoid some PGI compiler warnings
  this->SetBinary("???");
  this->SetBinaryBaseAddress(KWSYS_NULLPTR);
  this->Address = KWSYS_NULLPTR;
  this->SetSourceFile("???");
  this->SetFunction("???");
  this->SetLineNumber(-1);
  this->SetReportPath(0);
  // avoid PGI compiler warnings
  this->GetRealAddress();
  this->GetFunction();
  this->GetSourceFile();
  this->GetLineNumber();
}